

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

void __thiscall BayesianGameBase::Initialize(BayesianGameBase *this)

{
  undefined1 auVar1 [16];
  size_t *psVar2;
  reference pvVar3;
  ostream *poVar4;
  void *pvVar5;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  EOverflow *e;
  bad_alloc anon_var_0;
  size_t old_JA;
  size_t old_JT;
  Index i;
  allocator_type *in_stack_ffffffffffffff28;
  allocator_type *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 preserve;
  undefined1 *in_stack_ffffffffffffff58;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_stack_ffffffffffffff60;
  undefined1 local_55 [21];
  undefined8 local_40;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  local_38;
  
  if ((*(long *)(in_RDI + 0xd0) != 0) && (*(void **)(in_RDI + 0xd0) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0xd0));
  }
  if ((*(long *)(in_RDI + 200) != 0) && (*(void **)(in_RDI + 200) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 200));
  }
  psVar2 = IndexTools::CalculateStepSize
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff28);
  *(size_t **)(in_RDI + 0xd0) = psVar2;
  psVar2 = IndexTools::CalculateStepSize
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff28);
  *(size_t **)(in_RDI + 200) = psVar2;
  *(undefined8 *)(in_RDI + 0xb0) = 1;
  *(undefined8 *)(in_RDI + 0xb8) = 1;
  for (local_38.data_.
       super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0;
      preserve = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38),
      (ulong)local_38.data_.
             super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ <
      *(ulong *)(in_RDI + 0x78);
      local_38.data_.
      super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
           local_38.data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ + 1) {
    local_38.data_.
    super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(in_RDI + 0xb0);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98),
                        (ulong)local_38.data_.
                               super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                               ._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_);
    *(value_type *)(in_RDI + 0xb0) = *pvVar3 * *(long *)(in_RDI + 0xb0);
    if (*(_Base_ptr *)(in_RDI + 0xb0) <
        local_38.data_.
        super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      *(undefined1 *)(in_RDI + 0xc1) = 1;
    }
    local_38.data_.
    super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = *(_Base_ptr *)(in_RDI + 0xb8);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x80),
                        (ulong)local_38.data_.
                               super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                               ._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_);
    *(value_type *)(in_RDI + 0xb8) = *pvVar3 * *(long *)(in_RDI + 0xb8);
    if (*(_Base_ptr *)(in_RDI + 0xb8) <
        local_38.data_.
        super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      *(undefined1 *)(in_RDI + 0xc0) = 1;
    }
  }
  auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,*(undefined8 *)(in_RDI + 0xb0));
  if ((100000.0 < auVar1._0_8_) || ((*(byte *)(in_RDI + 0xc1) & 1) != 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"BayesianGameBase: using sparse models");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    *(undefined1 *)(in_RDI + 8) = 1;
  }
  else {
    *(undefined1 *)(in_RDI + 8) = 0;
    local_40 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x8a7207);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (value_type_conflict3 *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff60 = &local_38;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
    std::allocator<double>::~allocator((allocator<double> *)0x8a725a);
    pvVar5 = operator_new(0x18);
    preserve = (undefined1)((ulong)*(undefined8 *)(in_RDI + 0xb0) >> 0x38);
    in_stack_ffffffffffffff58 = local_55;
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x8a7296);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    *(void **)(in_RDI + 0x60) = pvVar5;
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x8a72cf);
  }
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    *(undefined8 *)(in_RDI + 0x68) = 0;
  }
  else {
    boost::numeric::ublas::
    mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
    ::resize(in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,(bool)preserve);
    boost::numeric::ublas::
    mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
    ::clear((mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
             *)0x8a746d);
    pvVar5 = operator_new(0x30);
    memset(pvVar5,0,0x30);
    std::
    map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::map((map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           *)0x8a7495);
    *(void **)(in_RDI + 0x68) = pvVar5;
    *(undefined8 *)(in_RDI + 0x60) = 0;
  }
  GetNrJointPolicies((BayesianGameBase *)0x8a74c4);
  if ((*(byte *)(in_RDI + 0xc1) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "BayesianGameBase::Initialize: Warning, joint types are overflowing");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if ((*(byte *)(in_RDI + 0xc0) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "BayesianGameBase::Initialize: Warning, joint actions are overflowing")
    ;
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  *(undefined1 *)(in_RDI + 0x70) = 1;
  return;
}

Assistant:

void BayesianGameBase::Initialize()
{
    if(_m_stepSizeTypes)
        delete[] _m_stepSizeTypes;
    if(_m_stepSizeActions)
        delete[] _m_stepSizeActions;
    _m_stepSizeTypes = IndexTools::CalculateStepSize(_m_nrTypes);
    _m_stepSizeActions = IndexTools::CalculateStepSize(_m_nrActions);

    //calculate # joint types and actions
    _m_nrJTypes = 1;
    _m_nrJA = 1;
    for(Index i = 0; i < _m_nrAgents; i++)
    {
        size_t old_JT = _m_nrJTypes;
        _m_nrJTypes *= _m_nrTypes[i];
        if (old_JT > _m_nrJTypes)
            _m_JToverflow = true;
            //throw EOverflow("BayesianGameBase::Number of joint types are overflowing");

        size_t old_JA = _m_nrJA;
        _m_nrJA *= _m_nrActions[i];
        if (old_JA > _m_nrJA)
            _m_JAoverflow = true;
            //throw EOverflow("BayesianGameBase::Number of joint actions are overflowing");
    }

    if(_m_nrJTypes>1e5 || _m_JToverflow)
    {
        cout << "BayesianGameBase: using sparse models" << endl;
        _m_useSparse=true;
    }
    else
    {
        _m_useSparse=false;
        try {
            _m_jTypeProbs = vector<double>(_m_nrJTypes, 0.0);
            _m_jointToIndTypes = new vector<vector<Index> >(_m_nrJTypes);
        } catch(std::bad_alloc)
        {
            cout << "BayesianGameBase: too many joint types ("
                 << _m_nrJTypes
                 << ") to have a full vector in memory, switching to sparse models..." << endl;
            _m_useSparse=true;
        }
    }

    //initialize the probability distribution over joint types:
    if(_m_useSparse)
    {
        _m_jTypeProbsSparse.resize(_m_nrJTypes);
        _m_jTypeProbsSparse.clear();
        _m_jointToIndTypesMap = new map<Index, vector<Index> >();
        _m_jointToIndTypes=0;
    }
    else
    {
        _m_jointToIndTypesMap=0;
    }


    // call this as it checks whether the joint policy indices will be
    // overflowing, resulting in an exception
    try {
        GetNrJointPolicies();
    }
    catch(EOverflow& e){ 
        cout << "BayesianGameBase::Initialize: Warning, joint policy indices are overflowing (don't rely on enumaration of all joint policies!)" << endl;
    }
    if(_m_JToverflow)
        cout << "BayesianGameBase::Initialize: Warning, joint types are overflowing" << endl;
    if(_m_JAoverflow)
        cout << "BayesianGameBase::Initialize: Warning, joint actions are overflowing" << endl;

    _m_initialized=true;
}